

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O1

int ikcp_input(ikcpcb *kcp,char *data,long size)

{
  IUINT32 *pIVar1;
  IUINT32 *__src;
  IQUEUEHEAD *pIVar2;
  byte bVar3;
  byte bVar4;
  IUINT32 IVar5;
  IUINT32 IVar6;
  IUINT32 IVar7;
  uint uVar8;
  uint uVar9;
  IQUEUEHEAD *pIVar10;
  IUINT32 *__ptr;
  uint uVar11;
  bool bVar12;
  uint uVar13;
  IUINT32 *pIVar14;
  IUINT32 *pIVar15;
  IKCPSEG *newseg;
  IQUEUEHEAD *pIVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  ulong __n;
  size_t __size;
  long lVar23;
  uint local_7c;
  
  IVar5 = kcp->snd_una;
  if (((kcp->logmask & 2) != 0) && (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)
     ) {
    ikcp_log(kcp,2,"[RI] %d bytes",size & 0xffffffff);
  }
  iVar17 = -1;
  if (0x17 < (int)size && data != (char *)0x0) {
    pIVar2 = &kcp->snd_buf;
    pIVar1 = &kcp->snd_nxt;
    local_7c = 0;
    bVar12 = false;
    pIVar14 = pIVar1;
    do {
      iVar20 = 3;
      if (0x17 < size) {
        IVar6 = *(IUINT32 *)data;
        iVar20 = 1;
        if (IVar6 == kcp->conv) {
          uVar13 = *(uint *)((long)data + 0x14);
          __n = (ulong)uVar13;
          __src = (IUINT32 *)((long)data + 0x18);
          lVar23 = size + -0x18;
          iVar20 = 1;
          if (((int)uVar13 < 0) || (size = lVar23 - __n, lVar23 < (long)__n)) {
            pIVar14 = (IUINT32 *)0xfffffffe;
            size = lVar23;
            data = (char *)__src;
          }
          else {
            bVar3 = (byte)*(IUINT32 *)((long)data + 4);
            if ((byte)(bVar3 + 0xab) < 0xfc) {
switchD_001391c3_default:
              pIVar14 = (IUINT32 *)0xfffffffd;
              size = lVar23;
              data = (char *)__src;
            }
            else {
              bVar4 = *(byte *)((long)data + 5);
              uVar8 = *(uint *)((long)data + 8);
              uVar9 = *(uint *)((long)data + 0xc);
              IVar7 = *(IUINT32 *)((long)data + 0x10);
              uVar21 = (uint)*(ushort *)((long)data + 6);
              kcp->rmt_wnd = uVar21;
              pIVar16 = (kcp->snd_buf).next;
              while ((pIVar16 != pIVar2 && (0 < (int)(IVar7 - *(int *)((long)&pIVar16[2].next + 4)))
                     )) {
                pIVar10 = pIVar16->next;
                pIVar10->prev = pIVar16->prev;
                pIVar16->prev->next = pIVar10;
                pIVar16->next = (IQUEUEHEAD *)0x0;
                pIVar16->prev = (IQUEUEHEAD *)0x0;
                if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                  free(pIVar16);
                }
                else {
                  (*ikcp_free_hook)(pIVar16);
                }
                kcp->nsnd_buf = kcp->nsnd_buf - 1;
                pIVar16 = pIVar10;
              }
              pIVar16 = (kcp->snd_buf).next;
              pIVar15 = (IUINT32 *)((long)&pIVar16[2].next + 4);
              if (pIVar16 == pIVar2) {
                pIVar15 = pIVar1;
              }
              kcp->snd_una = *pIVar15;
              switch((uint)bVar3) {
              case 0x51:
                if (((kcp->logmask & 0x10) != 0) &&
                   (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
                  ikcp_log(kcp,0x10,"input psh: sn=%lu ts=%lu",(ulong)uVar9,(ulong)uVar8);
                }
                if ((int)(uVar9 - (kcp->rcv_nxt + kcp->rcv_wnd)) < 0) {
                  uVar19 = kcp->ackcount + 1;
                  if (kcp->ackblock < uVar19) {
                    uVar18 = 8;
                    do {
                      uVar22 = uVar18;
                      uVar11 = (uint)uVar22;
                      uVar18 = (ulong)(uVar11 * 2);
                    } while (uVar11 < uVar19);
                    __size = uVar22 << 3;
                    if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
                      pIVar15 = (IUINT32 *)malloc(__size);
                    }
                    else {
                      pIVar15 = (IUINT32 *)(*ikcp_malloc_hook)(__size);
                    }
                    if (pIVar15 == (IUINT32 *)0x0) {
                      __assert_fail("acklist != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/3rd/kcp/ikcp.c"
                                    ,0x28a,"void ikcp_ack_push(ikcpcb *, IUINT32, IUINT32)");
                    }
                    __ptr = kcp->acklist;
                    if (__ptr != (IUINT32 *)0x0) {
                      if (kcp->ackcount != 0) {
                        uVar19 = 1;
                        uVar18 = 0;
                        do {
                          pIVar15[uVar19 - 1] = __ptr[uVar19 - 1];
                          pIVar15[uVar19] = __ptr[uVar19];
                          uVar18 = uVar18 + 1;
                          uVar19 = uVar19 + 2;
                        } while (uVar18 < kcp->ackcount);
                      }
                      if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                        free(__ptr);
                      }
                      else {
                        (*ikcp_free_hook)(__ptr);
                      }
                    }
                    kcp->acklist = pIVar15;
                    kcp->ackblock = uVar11;
                  }
                  pIVar15 = kcp->acklist;
                  uVar18 = (ulong)(kcp->ackcount * 2);
                  pIVar15[uVar18] = uVar9;
                  pIVar15[uVar18 + 1] = uVar8;
                  kcp->ackcount = kcp->ackcount + 1;
                  if (-1 < (int)(uVar9 - kcp->rcv_nxt)) {
                    if (ikcp_malloc_hook == (_func_void_ptr_size_t *)0x0) {
                      newseg = (IKCPSEG *)malloc(__n + 0x48);
                    }
                    else {
                      newseg = (IKCPSEG *)(*ikcp_malloc_hook)(__n + 0x48);
                    }
                    newseg->conv = IVar6;
                    newseg->cmd = (uint)bVar3;
                    newseg->frg = (uint)bVar4;
                    newseg->wnd = uVar21;
                    newseg->ts = uVar8;
                    newseg->sn = uVar9;
                    newseg->una = IVar7;
                    newseg->len = uVar13;
                    if (uVar13 != 0) {
                      memcpy(newseg->data,__src,__n);
                    }
                    ikcp_parse_data(kcp,newseg);
                  }
                }
                break;
              case 0x52:
                uVar13 = kcp->current - uVar8;
                if (-1 < (int)uVar13) {
                  iVar17 = kcp->rx_srtt;
                  if (iVar17 == 0) {
                    kcp->rx_srtt = uVar13;
                    kcp->rx_rttval = uVar13 >> 1;
                  }
                  else {
                    uVar19 = uVar13 - iVar17;
                    uVar21 = -uVar19;
                    if (0 < (int)uVar19) {
                      uVar21 = uVar19;
                    }
                    lVar23 = (long)kcp->rx_rttval * 3;
                    uVar22 = lVar23 + (ulong)uVar21;
                    uVar18 = (ulong)uVar21 + lVar23 + 3;
                    if (-1 < (long)uVar22) {
                      uVar18 = uVar22;
                    }
                    kcp->rx_rttval = (IINT32)(uVar18 >> 2);
                    iVar20 = iVar17 * 7 + uVar13;
                    iVar17 = iVar17 * 7 + uVar13 + 7;
                    if (-1 < iVar20) {
                      iVar17 = iVar20;
                    }
                    iVar17 = iVar17 >> 3;
                    if (iVar20 < 8) {
                      iVar17 = 1;
                    }
                    kcp->rx_srtt = iVar17;
                  }
                  uVar13 = kcp->rx_rttval << 2;
                  if (uVar13 < kcp->interval) {
                    uVar13 = kcp->interval;
                  }
                  uVar13 = uVar13 + kcp->rx_srtt;
                  if (uVar13 < (uint)kcp->rx_minrto) {
                    uVar13 = kcp->rx_minrto;
                  }
                  if (59999 < uVar13) {
                    uVar13 = 60000;
                  }
                  kcp->rx_rto = uVar13;
                }
                if ((-1 < (int)(uVar9 - kcp->snd_una)) && ((int)(uVar9 - kcp->snd_nxt) < 0)) {
                  do {
                    if (pIVar16 == pIVar2) break;
                    pIVar10 = pIVar16->next;
                    uVar13 = *(uint *)((long)&pIVar16[2].next + 4);
                    if (uVar9 == uVar13) {
                      pIVar10->prev = pIVar16->prev;
                      pIVar16->prev->next = pIVar10;
                      pIVar16->next = (IQUEUEHEAD *)0x0;
                      pIVar16->prev = (IQUEUEHEAD *)0x0;
                      if (ikcp_free_hook == (_func_void_void_ptr *)0x0) {
                        free(pIVar16);
                      }
                      else {
                        (*ikcp_free_hook)(pIVar16);
                      }
                      kcp->nsnd_buf = kcp->nsnd_buf - 1;
                      break;
                    }
                    pIVar16 = pIVar10;
                  } while (-1 < (int)(uVar9 - uVar13));
                }
                pIVar16 = (kcp->snd_buf).next;
                pIVar15 = (IUINT32 *)((long)&pIVar16[2].next + 4);
                if (pIVar16 == pIVar2) {
                  pIVar15 = pIVar1;
                }
                if (0 < (int)(uVar9 - local_7c)) {
                  local_7c = uVar9;
                }
                if (!bVar12) {
                  local_7c = uVar9;
                }
                kcp->snd_una = *pIVar15;
                bVar12 = true;
                if (((kcp->logmask & 0x20) != 0) &&
                   (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
                  ikcp_log(kcp,0x20,"input ack: sn=%lu rtt=%ld rto=%ld",(ulong)uVar9,
                           (long)(int)(kcp->current - uVar8),(long)kcp->rx_rto);
                }
                break;
              case 0x53:
                *(byte *)&kcp->probe = (byte)kcp->probe | 2;
                if (((kcp->logmask & 0x40) != 0) &&
                   (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
                  ikcp_log(kcp,0x40,"input probe");
                }
                break;
              case 0x54:
                if (((kcp->logmask & 0x80) != 0) &&
                   (kcp->writelog != (_func_void_char_ptr_IKCPCB_ptr_void_ptr *)0x0)) {
                  ikcp_log(kcp,0x80,"input wins: %lu",(ulong)uVar21);
                }
                break;
              default:
                goto switchD_001391c3_default;
              }
              data = (char *)((long)__src + __n);
              iVar20 = 0;
              pIVar14 = (IUINT32 *)((ulong)pIVar14 & 0xffffffff);
            }
          }
        }
        else {
          data = (char *)((long)data + 4);
          pIVar14 = (IUINT32 *)0xffffffff;
        }
      }
      iVar17 = (int)pIVar14;
    } while (iVar20 == 0);
    if (iVar20 == 3) {
      if (((bVar12) && (-1 < (int)(local_7c - kcp->snd_una))) &&
         ((int)(local_7c - kcp->snd_nxt) < 0)) {
        pIVar16 = (kcp->snd_buf).next;
        do {
          if (pIVar16 == pIVar2) break;
          uVar13 = *(uint *)((long)&pIVar16[2].next + 4);
          iVar17 = local_7c - uVar13;
          if ((local_7c != uVar13) && (-1 < iVar17)) {
            *(int *)&pIVar16[3].prev = *(int *)&pIVar16[3].prev + 1;
          }
          pIVar16 = pIVar16->next;
        } while (-1 < iVar17);
      }
      iVar17 = 0;
      if (0 < (int)(kcp->snd_una - IVar5)) {
        uVar13 = kcp->rmt_wnd;
        uVar8 = kcp->cwnd;
        if (uVar8 < uVar13) {
          uVar9 = kcp->mss;
          if (uVar8 < kcp->ssthresh) {
            kcp->cwnd = uVar8 + 1;
            kcp->incr = kcp->incr + uVar9;
          }
          else {
            if (kcp->incr < uVar9) {
              kcp->incr = uVar9;
            }
            uVar21 = (uVar9 >> 4) + kcp->incr + (uVar9 * uVar9) / kcp->incr;
            kcp->incr = uVar21;
            if ((uVar8 + 1) * uVar9 <= uVar21) {
              kcp->cwnd = ((uVar9 + uVar21) - 1) / (uVar9 + (uVar9 == 0));
            }
          }
          if (uVar13 < kcp->cwnd) {
            kcp->cwnd = uVar13;
            kcp->incr = uVar9 * uVar13;
          }
        }
        iVar17 = 0;
      }
    }
  }
  return iVar17;
}

Assistant:

int ikcp_input(ikcpcb *kcp, const char *data, long size)
{
	IUINT32 prev_una = kcp->snd_una;
	IUINT32 maxack = 0, latest_ts = 0;
	int flag = 0;

	if (ikcp_canlog(kcp, IKCP_LOG_INPUT)) {
		ikcp_log(kcp, IKCP_LOG_INPUT, "[RI] %d bytes", (int)size);
	}

	if (data == NULL || (int)size < (int)IKCP_OVERHEAD) return -1;

	while (1) {
		IUINT32 ts, sn, len, una, conv;
		IUINT16 wnd;
		IUINT8 cmd, frg;
		IKCPSEG *seg;

		if (size < (int)IKCP_OVERHEAD) break;

		data = ikcp_decode32u(data, &conv);
		if (conv != kcp->conv) return -1;

		data = ikcp_decode8u(data, &cmd);
		data = ikcp_decode8u(data, &frg);
		data = ikcp_decode16u(data, &wnd);
		data = ikcp_decode32u(data, &ts);
		data = ikcp_decode32u(data, &sn);
		data = ikcp_decode32u(data, &una);
		data = ikcp_decode32u(data, &len);

		size -= IKCP_OVERHEAD;

		if ((long)size < (long)len || (int)len < 0) return -2;

		if (cmd != IKCP_CMD_PUSH && cmd != IKCP_CMD_ACK &&
			cmd != IKCP_CMD_WASK && cmd != IKCP_CMD_WINS) 
			return -3;

		kcp->rmt_wnd = wnd;
		ikcp_parse_una(kcp, una);
		ikcp_shrink_buf(kcp);

		if (cmd == IKCP_CMD_ACK) {
			if (_itimediff(kcp->current, ts) >= 0) {
				ikcp_update_ack(kcp, _itimediff(kcp->current, ts));
			}
			ikcp_parse_ack(kcp, sn);
			ikcp_shrink_buf(kcp);
			if (flag == 0) {
				flag = 1;
				maxack = sn;
				latest_ts = ts;
			}	else {
				if (_itimediff(sn, maxack) > 0) {
				#ifndef IKCP_FASTACK_CONSERVE
					maxack = sn;
					latest_ts = ts;
				#else
					if (_itimediff(ts, latest_ts) > 0) {
						maxack = sn;
						latest_ts = ts;
					}
				#endif
				}
			}
			if (ikcp_canlog(kcp, IKCP_LOG_IN_ACK)) {
				ikcp_log(kcp, IKCP_LOG_IN_ACK, 
					"input ack: sn=%lu rtt=%ld rto=%ld", (unsigned long)sn, 
					(long)_itimediff(kcp->current, ts),
					(long)kcp->rx_rto);
			}
		}
		else if (cmd == IKCP_CMD_PUSH) {
			if (ikcp_canlog(kcp, IKCP_LOG_IN_DATA)) {
				ikcp_log(kcp, IKCP_LOG_IN_DATA, 
					"input psh: sn=%lu ts=%lu", (unsigned long)sn, (unsigned long)ts);
			}
			if (_itimediff(sn, kcp->rcv_nxt + kcp->rcv_wnd) < 0) {
				ikcp_ack_push(kcp, sn, ts);
				if (_itimediff(sn, kcp->rcv_nxt) >= 0) {
					seg = ikcp_segment_new(kcp, len);
					seg->conv = conv;
					seg->cmd = cmd;
					seg->frg = frg;
					seg->wnd = wnd;
					seg->ts = ts;
					seg->sn = sn;
					seg->una = una;
					seg->len = len;

					if (len > 0) {
						memcpy(seg->data, data, len);
					}

					ikcp_parse_data(kcp, seg);
				}
			}
		}
		else if (cmd == IKCP_CMD_WASK) {
			// ready to send back IKCP_CMD_WINS in ikcp_flush
			// tell remote my window size
			kcp->probe |= IKCP_ASK_TELL;
			if (ikcp_canlog(kcp, IKCP_LOG_IN_PROBE)) {
				ikcp_log(kcp, IKCP_LOG_IN_PROBE, "input probe");
			}
		}
		else if (cmd == IKCP_CMD_WINS) {
			// do nothing
			if (ikcp_canlog(kcp, IKCP_LOG_IN_WINS)) {
				ikcp_log(kcp, IKCP_LOG_IN_WINS,
					"input wins: %lu", (unsigned long)(wnd));
			}
		}
		else {
			return -3;
		}

		data += len;
		size -= len;
	}

	if (flag != 0) {
		ikcp_parse_fastack(kcp, maxack, latest_ts);
	}

	if (_itimediff(kcp->snd_una, prev_una) > 0) {
		if (kcp->cwnd < kcp->rmt_wnd) {
			IUINT32 mss = kcp->mss;
			if (kcp->cwnd < kcp->ssthresh) {
				kcp->cwnd++;
				kcp->incr += mss;
			}	else {
				if (kcp->incr < mss) kcp->incr = mss;
				kcp->incr += (mss * mss) / kcp->incr + (mss / 16);
				if ((kcp->cwnd + 1) * mss <= kcp->incr) {
				#if 1
					kcp->cwnd = (kcp->incr + mss - 1) / ((mss > 0)? mss : 1);
				#else
					kcp->cwnd++;
				#endif
				}
			}
			if (kcp->cwnd > kcp->rmt_wnd) {
				kcp->cwnd = kcp->rmt_wnd;
				kcp->incr = kcp->rmt_wnd * mss;
			}
		}
	}

	return 0;
}